

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_secondary_kvs(void)

{
  fdb_status fVar1;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  size_t valuelen_out;
  void *value_out;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffe68;
  fdb_file_handle *in_stack_fffffffffffffe70;
  size_t *in_stack_fffffffffffffe88;
  void **in_stack_fffffffffffffe90;
  fdb_kvs_handle *in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  fdb_kvs_handle *in_stack_fffffffffffffea8;
  undefined4 in_stack_ffffffffffffff90;
  fdb_kvs_handle **in_stack_ffffffffffffff98;
  void *local_60;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open((fdb_file_handle **)fconfig.compaction_cb_ctx,(char *)fconfig._96_8_,
           (fdb_config *)fconfig.compaction_cb);
  fdb_kvs_open_default
            (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->root,(fdb_kvs_config *)0x10410e);
  fdb_kvs_open_default
            (in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->root,(fdb_kvs_config *)0x104120);
  fVar1 = fdb_set_kv(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (size_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     (size_t)in_stack_fffffffffffffe88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3a);
    rollback_secondary_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3a,"void rollback_secondary_kvs()");
    }
  }
  fVar1 = fdb_set_kv(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (size_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     (size_t)in_stack_fffffffffffffe88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x3c);
    rollback_secondary_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x3c,"void rollback_secondary_kvs()");
    }
  }
  fdb_commit(in_stack_fffffffffffffe68,'\0');
  fVar1 = fdb_set_kv(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (size_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     (size_t)in_stack_fffffffffffffe88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x41);
    rollback_secondary_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x41,"void rollback_secondary_kvs()");
    }
  }
  fdb_commit(in_stack_fffffffffffffe68,'\0');
  fVar1 = fdb_del_kv(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     (size_t)in_stack_fffffffffffffe88);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x46);
    rollback_secondary_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x46,"void rollback_secondary_kvs()");
    }
  }
  fdb_commit(in_stack_fffffffffffffe68,'\0');
  fVar1 = fdb_get_kv(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (size_t)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     in_stack_fffffffffffffe88);
  free(local_60);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4c);
    rollback_secondary_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4c,"void rollback_secondary_kvs()");
    }
    fVar1 = FDB_RESULT_SUCCESS;
  }
  fVar1 = fdb_rollback(in_stack_ffffffffffffff98,CONCAT44(fVar1,in_stack_ffffffffffffff90));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x50);
    rollback_secondary_kvs::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x50,"void rollback_secondary_kvs()");
    }
  }
  fdb_close(in_stack_fffffffffffffe68);
  fdb_shutdown();
  memleak_end();
  if (rollback_secondary_kvs::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","rollback secondary kv");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","rollback secondary kv");
  }
  return;
}

Assistant:

void rollback_secondary_kvs()
{
    TEST_INIT();
    memleak_start();

    int r;
    void *value_out;
    size_t valuelen_out;

    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_file_handle *dbfile;
    fdb_kvs_handle *kv1, *kv2;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &kv1, &kvs_config);
    fdb_kvs_open_default(dbfile, &kv2, &kvs_config);

    // seq:2
    status = fdb_set_kv(kv1, (void *) "a", 1, (void *)"val-a", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-b", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:3
    status = fdb_set_kv(kv1, (void *) "b", 1, (void *)"val-v", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // seq:4
    status = fdb_del_kv(kv1, (void *)"a", 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // get 'a' via kv2
    status = fdb_get_kv(kv2, (void *)"b", 1, &value_out, &valuelen_out);
    free(value_out);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback seq:3 via kv2
    status = fdb_rollback(&kv2, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback secondary kv");
}